

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

void print_value(NODE *n)

{
  AttrType AVar1;
  
  AVar1 = (n->u).VALUE.type;
  if (AVar1 == STRING) {
    printf(" \"%s\"",(n->u).QUERY.conditionlist);
    return;
  }
  if (AVar1 != FLOAT) {
    if (AVar1 == INT) {
      printf(" %d",(ulong)(uint)(n->u).VALUE.ival);
      return;
    }
    return;
  }
  printf(" %f",(double)(n->u).VALUE.rval);
  return;
}

Assistant:

static void print_value(NODE *n)
{
   switch(n -> u.VALUE.type){
      case INT:
         printf(" %d", n -> u.VALUE.ival);
         break;
      case FLOAT:
         printf(" %f", n -> u.VALUE.rval);
         break;
      case STRING:
         printf(" \"%s\"", n -> u.VALUE.sval);
         break;
   }
}